

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O2

int __thiscall Fossilize::CLIParser::next_sint(CLIParser *this)

{
  long lVar1;
  char *__ptr;
  size_t sStack_50;
  allocator local_39;
  string local_38;
  
  if (this->argc == 0) {
    __ptr = "Fossilize ERROR: Tried to parse sint, but nothing left in arguments.\n";
    sStack_50 = 0x45;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,*this->argv,&local_39);
    lVar1 = std::__cxx11::stol(&local_38,(size_t *)0x0,10);
    std::__cxx11::string::_M_dispose();
    if ((int)lVar1 == lVar1) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (int)lVar1;
    }
    __ptr = "Fossilize ERROR: next_sint() out of range.\n";
    sStack_50 = 0x2b;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

int CLIParser::next_sint()
{
	if (!argc)
	{
		LOGE("Tried to parse sint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stol(*argv);
	if (val > numeric_limits<int>::max() || val < numeric_limits<int>::min())
	{
		LOGE("next_sint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return int(val);
}